

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Session::enforceNoUsedTokens(Session *this)

{
  pointer pTVar1;
  long *plVar2;
  runtime_error *this_00;
  long *plVar3;
  const_iterator it;
  pointer pTVar4;
  string msg;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pTVar4 = (this->m_unusedTokens).
           super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_unusedTokens).
           super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar4 == pTVar1) {
    return;
  }
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  do {
    std::operator+(&local_70,"  unrecognised option: ",&pTVar4->data);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pTVar4 = pTVar4 + 1;
  } while (pTVar4 != pTVar1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_50);
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }